

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void desc_art_fake(wchar_t a_idx)

{
  _Bool _Var1;
  object *poVar2;
  textblock *tb;
  object *obj;
  object *dest;
  char header [120];
  object object_body;
  object known_object_body;
  char acStack_318 [120];
  object local_2a0;
  object local_168;
  
  obj = &local_2a0;
  memset(obj,0,0x138);
  dest = &local_168;
  memset(dest,0,0x138);
  poVar2 = find_artifact(a_info + a_idx);
  if (poVar2 == (object *)0x0) {
    make_fake_artifact(obj,a_info + a_idx);
    local_168.artifact = local_2a0.artifact;
    local_168.kind = local_2a0.kind;
    local_2a0.known = dest;
    _Var1 = history_is_artifact_known(player,local_2a0.artifact);
    if (_Var1) {
      dest = &local_168;
      obj = &local_2a0;
      object_copy(dest,obj);
    }
  }
  else {
    dest = (object *)0x0;
    obj = poVar2;
  }
  handle_stuff(player);
  tb = object_info(obj,OINFO_NONE);
  object_desc(acStack_318,0x78,obj,0xc3,player);
  if (poVar2 == (object *)0x0) {
    object_wipe(dest);
    object_wipe(obj);
  }
  textui_textblock_show(tb,(region_conflict)ZEXT816(0),acStack_318);
  textblock_free(tb);
  return;
}

Assistant:

static void desc_art_fake(int a_idx)
{
	struct object *obj, *known_obj = NULL;
	struct object object_body = OBJECT_NULL, known_object_body = OBJECT_NULL;
	bool fake = false;

	char header[120];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	obj = find_artifact(&a_info[a_idx]);

	/* If it's been lost, make a fake artifact for it */
	if (!obj) {
		fake = true;
		obj = &object_body;
		known_obj = &known_object_body;

		make_fake_artifact(obj, &a_info[a_idx]);
		obj->known = known_obj;
		known_obj->artifact = obj->artifact;
		known_obj->kind = obj->kind;

		/* Check the history entry, to see if it was fully known before it
		 * was lost */
		if (history_is_artifact_known(player, obj->artifact))
			/* Be very careful not to influence anything but this object */
			object_copy(known_obj, obj);
	}

	/* Hack -- Handle stuff */
	handle_stuff(player);

	tb = object_info(obj, OINFO_NONE);
	object_desc(header, sizeof(header), obj,
		ODESC_PREFIX | ODESC_FULL | ODESC_CAPITAL, player);
	if (fake) {
		object_wipe(known_obj);
		object_wipe(obj);
	}

	textui_textblock_show(tb, area, header);
	textblock_free(tb);
}